

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_callback_activate_nolock_(event_base *base,event_callback *evcb)

{
  unsigned_long uVar1;
  ushort uVar2;
  unsigned_long uVar3;
  int local_24;
  int r;
  event_callback *evcb_local;
  event_base *base_local;
  
  local_24 = 1;
  if ((evcb->evcb_flags & 0x40U) == 0) {
    uVar2 = evcb->evcb_flags & 0x28;
    if ((evcb->evcb_flags & 0x28U) != 0) {
      if (uVar2 == 8) {
        return 0;
      }
      if (uVar2 != 0x20) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xbcb,"0","event_callback_activate_nolock_");
      }
      event_queue_remove_active_later(base,evcb);
      local_24 = 0;
    }
    event_queue_insert_active(base,evcb);
    if (((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) &&
       (uVar1 = base->th_owner_id, uVar3 = (*evthread_id_fn_)(), uVar1 != uVar3)) {
      evthread_notify_base(base);
    }
    base_local._4_4_ = local_24;
  }
  else {
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_callback_activate_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	int r = 1;

	if (evcb->evcb_flags & EVLIST_FINALIZING)
		return 0;

	switch (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) {
	default:
		EVUTIL_ASSERT(0);
		EVUTIL_FALLTHROUGH;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		r = 0;
		break;
	case EVLIST_ACTIVE:
		return 0;
	case 0:
		break;
	}

	event_queue_insert_active(base, evcb);

	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	return r;
}